

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

stbtt__buf stbtt__new_buf(void *p,size_t size)

{
  stbtt__buf sVar1;
  size_t size_local;
  void *p_local;
  stbtt__buf r;
  
  size_local._0_4_ = (int)size;
  sVar1.cursor = 0;
  sVar1.data = (uchar *)p;
  sVar1.size = (int)size_local;
  return sVar1;
}

Assistant:

static stbtt__buf stbtt__new_buf(const void *p, size_t size)
{
   stbtt__buf r;
   STBTT_assert(size < 0x40000000);
   r.data = (stbtt_uint8*) p;
   r.size = (int) size;
   r.cursor = 0;
   return r;
}